

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

float ScaleSumSamples_C(float *src,float *dst,float scale,int width)

{
  float fVar1;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  if (width < 1) {
    width = 0;
  }
  fVar3 = 0.0;
  for (; width != (int)lVar2; lVar2 = lVar2 + 1) {
    fVar1 = src[lVar2];
    fVar3 = fVar3 + fVar1 * fVar1;
    dst[lVar2] = fVar1 * scale;
  }
  return fVar3;
}

Assistant:

float ScaleSumSamples_C(const float* src, float* dst, float scale, int width) {
  float fsum = 0.f;
  int i;
  for (i = 0; i < width; ++i) {
    float v = *src++;
    fsum += v * v;
    *dst++ = v * scale;
  }
  return fsum;
}